

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template.h
# Opt level: O2

bool __thiscall
test_uintwide_t_n_binary_ops_template<2048U,_unsigned_int,_void>::test_binary_sqrt
          (test_uintwide_t_n_binary_ops_template<2048U,_unsigned_int,_void> *this)

{
  anon_class_32_4_006e9c57 parallel_function;
  atomic_flag test_lock;
  bool result_is_ok;
  atomic_flag *in_stack_ffffffffffffffd0;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 *local_20;
  undefined1 *puStack_18;
  test_uintwide_t_n_binary_ops_template<2048U,_unsigned_int,_void> *local_10;
  
  puStack_18 = &local_21;
  local_21 = 1;
  local_20 = &local_22;
  local_22 = 0;
  parallel_function.u_boost =
       (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
        **)puStack_18;
  parallel_function.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)local_20;
  parallel_function.distribution = (distribution_type *)this;
  parallel_function.rnd_lock = in_stack_ffffffffffffffd0;
  local_10 = this;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_template<2048u,unsigned_int,void>::test_binary_sqrt()const::_lambda(unsigned_long)_1_>
            (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
               number_of_cases,parallel_function);
  return (bool)local_21;
}

Assistant:

WIDE_INTEGER_NODISCARD auto test_binary_sqrt() const -> bool
    {
      bool result_is_ok = true;

      std::atomic_flag test_lock = ATOMIC_FLAG_INIT;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        size(),
        [&test_lock, &result_is_ok, this](std::size_t i)
        {
          const boost_uint_type c_boost = sqrt(a_boost[i]);
          const local_uint_type c_local = sqrt(a_local[i]);

          const std::string str_boost = hexlexical_cast(c_boost);
          const std::string str_local = hexlexical_cast(c_local);

          while(test_lock.test_and_set()) { ; }
          result_is_ok = ((str_boost == str_local) && result_is_ok);
          test_lock.clear();
        }
      );

      return result_is_ok;
    }